

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v5::internal::
     handle_char_specs<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_spec_handler>
               (basic_format_specs<char> *specs,char_spec_handler *handler)

{
  format_error *this;
  
  if ((specs->type_ != '\0') && (specs->type_ != 'c')) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_int<char,fmt::v5::basic_format_specs<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               handler->formatter,handler->value,handler->formatter->specs_);
    return;
  }
  if (((specs->super_align_spec).align_ != ALIGN_NUMERIC) && (specs->flags_ == 0)) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               handler->formatter,1,&handler->formatter->specs_->super_align_spec,
               (char_writer)(char_type)*(undefined4 *)&handler->value);
    return;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"invalid format specifier for char");
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_CONSTEXPR Char type() const { return type_; }